

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

int32 __thiscall TTD::MarkTable::FindIndexForKey(MarkTable *this,uint64 addr)

{
  int iVar1;
  uint64 currAddr;
  uint32 probeIndex;
  uint32 offset;
  uint64 primaryAddr;
  uint32 primaryIndex;
  uint32 primaryMask;
  uint64 addr_local;
  MarkTable *this_local;
  
  if (this->m_addrArray == (uint64 *)0x0) {
    TTDAbort_unrecoverable_error("Not valid!!");
  }
  this_local._4_4_ = (uint)addr & this->m_capcity - 1;
  if (this->m_addrArray[this_local._4_4_] != addr && this->m_addrArray[this_local._4_4_] != 0) {
    iVar1 = (int)(addr % (ulong)this->m_h2Prime);
    currAddr._0_4_ = this_local._4_4_ + iVar1 & this->m_capcity - 1;
    while (this->m_addrArray[(uint)currAddr] != addr && this->m_addrArray[(uint)currAddr] != 0) {
      currAddr._0_4_ = (uint)currAddr + 1 & this->m_capcity - 1;
      if ((uint)currAddr == (this_local._4_4_ + iVar1 & this->m_capcity - 1)) {
        TTDAbort_unrecoverable_error("We messed up.");
      }
    }
    this_local._4_4_ = (uint)currAddr;
  }
  return this_local._4_4_;
}

Assistant:

int32 FindIndexForKey(uint64 addr) const
        {
            TTDAssert(this->m_addrArray != nullptr, "Not valid!!");

            uint32 primaryMask = this->m_capcity - 1;

            uint32 primaryIndex = TTD_MARK_TABLE_HASH1(addr, this->m_capcity);
            uint64 primaryAddr = this->m_addrArray[primaryIndex];
            if ((primaryAddr == addr) | (primaryAddr == 0))
            {
                return (int32)primaryIndex;
            }

            //do a hash for the second offset to avoid clustering and then do linear probing
            uint32 offset = TTD_MARK_TABLE_HASH2(addr, this->m_h2Prime);
            uint32 probeIndex = TTD_MARK_TABLE_INDEX(primaryIndex + offset, this->m_capcity);
            while (true)
            {
                uint64 currAddr = this->m_addrArray[probeIndex];
                if ((currAddr == addr) | (currAddr == 0))
                {
                    return (int32)probeIndex;
                }
                probeIndex = TTD_MARK_TABLE_INDEX(probeIndex + 1, this->m_capcity);

                TTDAssert(probeIndex != ((primaryIndex + offset) & primaryMask), "We messed up.");
            }
        }